

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O1

void __thiscall orphanage_tests::DoS_mapOrphans::test_method(DoS_mapOrphans *this)

{
  uchar *puVar1;
  pointer pCVar2;
  uint uVar3;
  long lVar4;
  seconds mock_time_in;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pCVar8;
  bool bVar9;
  int iVar10;
  time_point tVar11;
  ulong uVar12;
  uint uVar13;
  FastRandomContext *this_00;
  CScript *pCVar14;
  ulong uVar15;
  iterator in_R8;
  iterator pvVar16;
  iterator in_R9;
  iterator pvVar17;
  long lVar18;
  long in_FS_OFFSET;
  const_string file;
  Span<std::byte> output;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar19;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 local_7f4 [8];
  uint uStack_7ec;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 local_7c8 [16];
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  size_t expected_num_orphans;
  char *local_6d0;
  pointer local_6c8;
  CTransactionRef timeout_tx;
  undefined1 local_6b0 [16];
  char *local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  pointer local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  CMutableTransaction tx;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  CKey key;
  undefined1 local_5b8 [8];
  undefined1 local_5b0 [8];
  CTransactionRef txPrev;
  FastRandomContext rng;
  _Rb_tree_node_base local_4d0;
  size_t local_4b0;
  bool local_440;
  _Rb_tree_node_base local_430;
  size_t local_410;
  _Rb_tree_node_base local_400;
  size_t local_3e0;
  pointer puStack_3d8;
  pointer local_3d0;
  pointer puStack_3c8;
  _Rb_tree_node_base local_3b8;
  size_t local_398;
  _Rb_tree_node_base local_388;
  size_t local_368;
  _Rb_tree_node_base local_358;
  size_t local_338;
  pointer pCStack_330;
  pointer local_328;
  pointer pCStack_320;
  pointer local_318;
  pointer pCStack_310;
  pointer local_308;
  uchar auStack_300 [64];
  _Rb_tree_node_base local_2c0;
  size_t local_2a0;
  _Rb_tree_node_base local_290;
  size_t local_270;
  _Rb_tree_node_base local_260;
  size_t local_240;
  _Rb_tree_node_base local_230;
  size_t local_210;
  undefined1 local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  shared_count sStack_1f8;
  CTransactionRef *local_1f0;
  undefined1 local_1b8 [28];
  size_type sStack_19c;
  FillableSigningProvider keystore;
  TxOrphanageTest orphanage;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng;
  rng.super_RandomMixin<FastRandomContext>.bitbuf_size = 0;
  rng.super_RandomMixin<FastRandomContext>._12_4_ = 0;
  rng.rng.m_aligned.input[0] = 0;
  rng.rng.m_aligned.input[1] = 0;
  rng.rng.m_aligned.input[2] = 0;
  rng.rng.m_aligned.input[3] = 0;
  rng.super_RandomMixin<FastRandomContext>.bitbuf = 0x21;
  FastRandomContext::Reseed(this_00,(uint256 *)&rng);
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orphanage.super_TxOrphanage.m_orphan_list.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  orphanage.super_TxOrphanage.m_next_sweep.__d.__r = (duration)0;
  key.fCompressed = false;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = orphanage.super_TxOrphanage.m_peer_work_set._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_left;
  orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
  orphanage.m_rng = this_00;
  MakeNewKeyWithFastRandomContext(&key,this_00);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x78;
  file.m_begin = (iterator)&local_5d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5e8,msg);
  CKey::GetPubKey((CPubKey *)&rng,&key);
  _cVar19 = 0x506a80;
  iVar10 = (*keystore.super_SigningProvider._vptr_SigningProvider[10])(&keystore,&key,&rng);
  local_208[0] = (char)iVar10;
  _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  rng.rng.m_aligned.input._8_8_ = &tx;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_10e7524;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)(anon_var_dwarf_10e7524 + 0x14);
  rng.super_RandomMixin<FastRandomContext>._8_8_ =
       rng.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  rng.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013d3df0;
  rng.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_5f0 = "";
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&rng,1,0,WARN,_cVar19,(size_t)&local_5f8,
             0x78);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  tVar11 = NodeClock::now();
  mock_time_in.__r = (long)tVar11.__d.__r / 1000000000;
  SetMockTime(mock_time_in);
  lVar18 = 0;
  do {
    CMutableTransaction::CMutableTransaction(&tx);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
    ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).n = 0;
    rng.rng.m_aligned.input[0] = 0;
    rng.rng.m_aligned.input[1] = 0;
    rng.rng.m_aligned.input[2] = 0;
    rng.rng.m_aligned.input[3] = 0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf = 0;
    rng.super_RandomMixin<FastRandomContext>.bitbuf_size = 0;
    rng.super_RandomMixin<FastRandomContext>._12_4_ = 0;
    output.m_size = 0x20;
    output.m_data = (byte *)&rng;
    FastRandomContext::fillrand(this_00,output);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         rng.rng.m_aligned.input._0_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         rng.rng.m_aligned.input._8_8_;
    *(uint64_t *)
     ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         rng.super_RandomMixin<FastRandomContext>.bitbuf;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         rng.super_RandomMixin<FastRandomContext>._8_8_;
    uVar3 = ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size;
    uVar13 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar13 = uVar3;
    }
    pCVar14 = (CScript *)
              ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._union.
              indirect_contents.indirect;
    if (uVar3 < 0x1d) {
      pCVar14 = &(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig;
    }
    rng.super_RandomMixin<FastRandomContext>.bitbuf =
         CONCAT71(rng.super_RandomMixin<FastRandomContext>.bitbuf._1_7_,0x51);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
               (uchar *)((long)&(pCVar14->super_CScriptBase)._union + (long)(int)uVar13),
               (uchar *)&rng);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)&local_50,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = (uint32_t)local_50.m_message.pn.pi_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf = local_50._0_8_;
    rng.super_RandomMixin<FastRandomContext>._8_8_ = local_50.m_message.px;
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)local_1b8,(CTxDestination *)&rng);
    pCVar8 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar14 = &(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey;
    if (0x1c < ((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
      free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
    }
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
         CONCAT44(local_1b8._16_4_,local_1b8._12_4_);
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) =
         CONCAT44(local_1b8._24_4_,local_1b8._20_4_);
    (pCVar14->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_1b8._0_8_;
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) =
         CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    (pCVar8->scriptPubKey).super_CScriptBase._size = sStack_19c;
    sStack_19c = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    rng.super_RandomMixin<FastRandomContext>.bitbuf = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &rng.super_RandomMixin<FastRandomContext>.bitbuf_size,(CTransaction **)&rng,
               (allocator<CTransaction> *)local_208,&tx);
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)&rng,lVar18);
    if (rng.super_RandomMixin<FastRandomContext>._8_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 rng.super_RandomMixin<FastRandomContext>._8_8_);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x32);
  lVar18 = 0;
  do {
    TxOrphanageTest::RandomOrphan((TxOrphanageTest *)&txPrev);
    CMutableTransaction::CMutableTransaction(&tx);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
    ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).n = 0;
    uVar5 = *(undefined8 *)
             ((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    uVar6 = *(undefined8 *)
             (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    uVar7 = *(undefined8 *)
             (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)
          (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
           ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
    *(undefined8 *)
     ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar5;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)&local_50,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = (uint32_t)local_50.m_message.pn.pi_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf = local_50._0_8_;
    rng.super_RandomMixin<FastRandomContext>._8_8_ = local_50.m_message.px;
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)local_1b8,(CTxDestination *)&rng);
    pCVar8 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar14 = &(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey;
    if (0x1c < ((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
      free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
    }
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
         CONCAT44(local_1b8._16_4_,local_1b8._12_4_);
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) =
         CONCAT44(local_1b8._24_4_,local_1b8._20_4_);
    *(undefined8 *)&(pCVar14->super_CScriptBase)._union = local_1b8._0_8_;
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) =
         CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    (pCVar8->scriptPubKey).super_CScriptBase._size = sStack_19c;
    sStack_19c = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    rng.super_RandomMixin<FastRandomContext>.bitbuf =
         rng.super_RandomMixin<FastRandomContext>.bitbuf & 0xffffffffffff0000;
    local_4d0._M_color = _S_red;
    local_4d0._M_parent = (_Base_ptr)0x0;
    memset(&rng.super_RandomMixin<FastRandomContext>.bitbuf_size,0,0xb8);
    local_4d0._M_left = &local_4d0;
    local_4b0 = 0;
    local_440 = false;
    local_430._M_color = _S_red;
    local_430._M_parent = (_Base_ptr)0x0;
    local_430._M_left = &local_430;
    local_410 = 0;
    local_400._M_color = _S_red;
    local_400._M_parent = (_Base_ptr)0x0;
    local_400._M_left = &local_400;
    local_3b8._M_color = _S_red;
    local_3b8._M_parent = (_Base_ptr)0x0;
    local_3e0 = 0;
    puStack_3d8 = (pointer)0x0;
    local_3d0 = (pointer)0x0;
    puStack_3c8 = (pointer)0x0;
    local_3b8._M_left = &local_3b8;
    local_398 = 0;
    local_388._M_color = _S_red;
    local_388._M_parent = (_Base_ptr)0x0;
    local_388._M_left = &local_388;
    local_368 = 0;
    local_358._M_color = _S_red;
    local_358._M_parent = (_Base_ptr)0x0;
    local_358._M_left = &local_358;
    local_2c0._M_color = _S_red;
    local_2c0._M_parent = (_Base_ptr)0x0;
    local_338 = 0;
    pCStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pCStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    pCStack_310 = (pointer)0x0;
    local_308 = (pointer)0x0;
    auStack_300[0] = '\0';
    auStack_300[1] = '\0';
    auStack_300[2] = '\0';
    auStack_300[3] = '\0';
    auStack_300[4] = '\0';
    auStack_300[5] = '\0';
    auStack_300[6] = '\0';
    auStack_300[7] = '\0';
    auStack_300[8] = '\0';
    auStack_300[9] = '\0';
    auStack_300[10] = '\0';
    auStack_300[0xb] = '\0';
    auStack_300[0xc] = '\0';
    auStack_300[0xd] = '\0';
    auStack_300[0xe] = '\0';
    auStack_300[0xf] = '\0';
    auStack_300[0x10] = '\0';
    auStack_300[0x11] = '\0';
    auStack_300[0x12] = '\0';
    auStack_300[0x13] = '\0';
    auStack_300[0x14] = '\0';
    auStack_300[0x15] = '\0';
    auStack_300[0x16] = '\0';
    auStack_300[0x17] = '\0';
    auStack_300[0x18] = '\0';
    auStack_300[0x19] = '\0';
    auStack_300[0x1a] = '\0';
    auStack_300[0x1b] = '\0';
    auStack_300[0x1c] = '\0';
    auStack_300[0x1d] = '\0';
    auStack_300[0x1e] = '\0';
    auStack_300[0x1f] = '\0';
    auStack_300[0x20] = '\0';
    auStack_300[0x21] = '\0';
    auStack_300[0x22] = '\0';
    auStack_300[0x23] = '\0';
    auStack_300[0x24] = '\0';
    auStack_300[0x25] = '\0';
    auStack_300[0x26] = '\0';
    auStack_300[0x27] = '\0';
    auStack_300[0x28] = '\0';
    auStack_300[0x29] = '\0';
    auStack_300[0x2a] = '\0';
    auStack_300[0x2b] = '\0';
    auStack_300[0x2c] = '\0';
    auStack_300[0x2d] = '\0';
    auStack_300[0x2e] = '\0';
    auStack_300[0x2f] = '\0';
    auStack_300[0x30] = '\0';
    auStack_300[0x31] = '\0';
    auStack_300[0x32] = '\0';
    auStack_300[0x33] = '\0';
    local_2c0._M_left = &local_2c0;
    local_2a0 = 0;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_290._M_left = &local_290;
    local_270 = 0;
    local_260._M_color = _S_red;
    local_260._M_parent = (_Base_ptr)0x0;
    local_260._M_left = &local_260;
    local_240 = 0;
    local_230._M_color = _S_red;
    local_230._M_parent = (_Base_ptr)0x0;
    local_230._M_left = &local_230;
    local_210 = 0;
    local_640 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_638 = "";
    local_650 = &boost::unit_test::basic_cstring<char_const>::null;
    local_648 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x9a;
    file_00.m_begin = (iterator)&local_640;
    msg_00.m_end = pvVar17;
    msg_00.m_begin = pvVar16;
    local_4d0._M_right = local_4d0._M_left;
    local_430._M_right = local_430._M_left;
    local_400._M_right = local_400._M_left;
    local_3b8._M_right = local_3b8._M_left;
    local_388._M_right = local_388._M_left;
    local_358._M_right = local_358._M_left;
    local_2c0._M_right = local_2c0._M_left;
    local_290._M_right = local_290._M_left;
    local_260._M_right = local_260._M_left;
    local_230._M_right = local_230._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_650,
               msg_00);
    _cVar19 = 0x50712d;
    bVar9 = SignSignature(&keystore.super_SigningProvider,
                          txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&tx,0,1,(SignatureData *)&rng);
    local_1b8[0] = bVar9;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_4_ = 0;
    local_1b8._20_4_ = 0;
    local_50._0_8_ = "SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty)";
    local_50.m_message.px = (element_type *)0xee542c;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (CTransactionRef *)&local_50;
    local_660 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_658 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1b8,(lazy_ostream *)local_208,1,0,WARN,_cVar19,
               (size_t)&local_660,0x9a);
    boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
    local_208 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              (&_Stack_200,(CTransaction **)local_208,(allocator<CTransaction> *)local_1b8,&tx);
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)local_208,lVar18);
    if ((element_type *)_Stack_200._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    SignatureData::~SignatureData((SignatureData *)&rng);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
    if (txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x32);
  lVar18 = 0;
  do {
    TxOrphanageTest::RandomOrphan((TxOrphanageTest *)&txPrev);
    CMutableTransaction::CMutableTransaction(&tx);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue = 1000000;
    CKey::GetPubKey((CPubKey *)local_208,&key);
    PKHash::PKHash((PKHash *)&local_50,(CPubKey *)local_208);
    rng.rng.m_aligned.input[0] = (uint32_t)local_50.m_message.pn.pi_;
    rng.super_RandomMixin<FastRandomContext>.bitbuf = local_50._0_8_;
    rng.super_RandomMixin<FastRandomContext>._8_8_ = local_50.m_message.px;
    rng.rng.m_buffer._M_elems[8] = 2;
    GetScriptForDestination((CScript *)local_1b8,(CTxDestination *)&rng);
    pCVar8 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar14 = &(tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey;
    if (0x1c < ((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase._size) {
      free((pCVar14->super_CScriptBase)._union.indirect_contents.indirect);
    }
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0xc) =
         CONCAT44(local_1b8._16_4_,local_1b8._12_4_);
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 0x14) =
         CONCAT44(local_1b8._24_4_,local_1b8._20_4_);
    (pCVar14->super_CScriptBase)._union.indirect_contents.indirect = (char *)local_1b8._0_8_;
    *(ulong *)((long)&(pCVar8->scriptPubKey).super_CScriptBase._union + 8) =
         CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
    (pCVar8->scriptPubKey).super_CScriptBase._size = sStack_19c;
    sStack_19c = 0;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&rng);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,0xad9);
    if (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar12 = 0;
      do {
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12].prevout.n = (uint32_t)uVar12;
        uVar5 = *(undefined8 *)
                 ((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar6 = *(undefined8 *)
                 (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        uVar7 = *(undefined8 *)
                 (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        puVar1 = tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12].prevout.hash.m_wrapped.
                 super_base_blob<256U>.m_data._M_elems + 0x10;
        *(undefined8 *)puVar1 =
             *(undefined8 *)
              (((txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)(puVar1 + 8) = uVar7;
        *(undefined8 *)
         tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar12].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar5;
        *(undefined8 *)
         (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar6
        ;
        uVar12 = (ulong)((uint32_t)uVar12 + 1);
        uVar15 = ((long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      } while (uVar12 <= uVar15 && uVar15 - uVar12 != 0);
    }
    rng.super_RandomMixin<FastRandomContext>.bitbuf =
         rng.super_RandomMixin<FastRandomContext>.bitbuf & 0xffffffffffff0000;
    local_4d0._M_color = _S_red;
    local_4d0._M_parent = (_Base_ptr)0x0;
    memset(&rng.super_RandomMixin<FastRandomContext>.bitbuf_size,0,0xb8);
    local_4d0._M_left = &local_4d0;
    local_4b0 = 0;
    local_440 = false;
    local_430._M_color = _S_red;
    local_430._M_parent = (_Base_ptr)0x0;
    local_430._M_left = &local_430;
    local_410 = 0;
    local_400._M_color = _S_red;
    local_400._M_parent = (_Base_ptr)0x0;
    local_400._M_left = &local_400;
    local_3b8._M_color = _S_red;
    local_3b8._M_parent = (_Base_ptr)0x0;
    local_3e0 = 0;
    puStack_3d8 = (pointer)0x0;
    local_3d0 = (pointer)0x0;
    puStack_3c8 = (pointer)0x0;
    local_3b8._M_left = &local_3b8;
    local_398 = 0;
    local_388._M_color = _S_red;
    local_388._M_parent = (_Base_ptr)0x0;
    local_388._M_left = &local_388;
    local_368 = 0;
    local_358._M_color = _S_red;
    local_358._M_parent = (_Base_ptr)0x0;
    local_358._M_left = &local_358;
    local_2c0._M_color = _S_red;
    local_2c0._M_parent = (_Base_ptr)0x0;
    local_338 = 0;
    pCStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pCStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    pCStack_310 = (pointer)0x0;
    local_308 = (pointer)0x0;
    auStack_300[0] = '\0';
    auStack_300[1] = '\0';
    auStack_300[2] = '\0';
    auStack_300[3] = '\0';
    auStack_300[4] = '\0';
    auStack_300[5] = '\0';
    auStack_300[6] = '\0';
    auStack_300[7] = '\0';
    auStack_300[8] = '\0';
    auStack_300[9] = '\0';
    auStack_300[10] = '\0';
    auStack_300[0xb] = '\0';
    auStack_300[0xc] = '\0';
    auStack_300[0xd] = '\0';
    auStack_300[0xe] = '\0';
    auStack_300[0xf] = '\0';
    auStack_300[0x10] = '\0';
    auStack_300[0x11] = '\0';
    auStack_300[0x12] = '\0';
    auStack_300[0x13] = '\0';
    auStack_300[0x14] = '\0';
    auStack_300[0x15] = '\0';
    auStack_300[0x16] = '\0';
    auStack_300[0x17] = '\0';
    auStack_300[0x18] = '\0';
    auStack_300[0x19] = '\0';
    auStack_300[0x1a] = '\0';
    auStack_300[0x1b] = '\0';
    auStack_300[0x1c] = '\0';
    auStack_300[0x1d] = '\0';
    auStack_300[0x1e] = '\0';
    auStack_300[0x1f] = '\0';
    auStack_300[0x20] = '\0';
    auStack_300[0x21] = '\0';
    auStack_300[0x22] = '\0';
    auStack_300[0x23] = '\0';
    auStack_300[0x24] = '\0';
    auStack_300[0x25] = '\0';
    auStack_300[0x26] = '\0';
    auStack_300[0x27] = '\0';
    auStack_300[0x28] = '\0';
    auStack_300[0x29] = '\0';
    auStack_300[0x2a] = '\0';
    auStack_300[0x2b] = '\0';
    auStack_300[0x2c] = '\0';
    auStack_300[0x2d] = '\0';
    auStack_300[0x2e] = '\0';
    auStack_300[0x2f] = '\0';
    auStack_300[0x30] = '\0';
    auStack_300[0x31] = '\0';
    auStack_300[0x32] = '\0';
    auStack_300[0x33] = '\0';
    local_2c0._M_left = &local_2c0;
    local_2a0 = 0;
    local_290._M_color = _S_red;
    local_290._M_parent = (_Base_ptr)0x0;
    local_290._M_left = &local_290;
    local_270 = 0;
    local_260._M_color = _S_red;
    local_260._M_parent = (_Base_ptr)0x0;
    local_260._M_left = &local_260;
    local_240 = 0;
    local_230._M_color = _S_red;
    local_230._M_parent = (_Base_ptr)0x0;
    local_230._M_left = &local_230;
    local_210 = 0;
    local_670 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_668 = "";
    local_680 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_678 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xaf;
    file_01.m_begin = (iterator)&local_670;
    msg_01.m_end = pvVar17;
    msg_01.m_begin = pvVar16;
    local_4d0._M_right = local_4d0._M_left;
    local_430._M_right = local_430._M_left;
    local_400._M_right = local_400._M_left;
    local_3b8._M_right = local_3b8._M_left;
    local_388._M_right = local_388._M_left;
    local_358._M_right = local_358._M_left;
    local_2c0._M_right = local_2c0._M_left;
    local_290._M_right = local_290._M_left;
    local_260._M_right = local_260._M_left;
    local_230._M_right = local_230._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_680,
               msg_01);
    _cVar19 = 0x5076ca;
    bVar9 = SignSignature(&keystore.super_SigningProvider,
                          txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&tx,0,1,(SignatureData *)&rng);
    local_1b8[0] = bVar9;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_4_ = 0;
    local_1b8._20_4_ = 0;
    local_50._0_8_ = "SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty)";
    local_50.m_message.px = (element_type *)0xee542c;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_690 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_688 = (pointer)0xee53cc;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    local_1f0 = (CTransactionRef *)&local_50;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1b8,(lazy_ostream *)local_208,1,0,WARN,_cVar19,
               (size_t)&local_690,0xaf);
    boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
    if (1 < (ulong)(((long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)) {
      uVar12 = 1;
      uVar15 = 2;
      do {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12].scriptSig.super_CScriptBase,
                   &((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase);
        uVar12 = ((long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar9 = uVar15 <= uVar12;
        lVar4 = uVar12 - uVar15;
        uVar12 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar9 && lVar4 != 0);
    }
    local_6a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_698 = "";
    local_6b0._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_6b0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xb5;
    file_02.m_begin = (iterator)&local_6a0;
    msg_02.m_end = pvVar17;
    msg_02.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)local_6b0,
               msg_02);
    local_50._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.m_message,
               (CTransaction **)&local_50,(allocator<CTransaction> *)local_208,&tx);
    _cVar19 = 0x507883;
    bVar9 = TxOrphanage::AddTx(&orphanage.super_TxOrphanage,(CTransactionRef *)&local_50,lVar18);
    local_1b8[0] = !bVar9;
    local_1b8._8_4_ = 0;
    local_1b8._12_4_ = 0;
    local_1b8._16_4_ = 0;
    local_1b8._20_4_ = 0;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10e7583;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee5458;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = &timeout_tx;
    local_6d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_6c8 = (pointer)0xee53cc;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1b8,(lazy_ostream *)local_208,1,0,WARN,_cVar19,
               (size_t)&local_6d0,0xb5);
    boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
    if (local_50.m_message.px != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.m_message.px);
    }
    SignatureData::~SignatureData((SignatureData *)&rng);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
    if (txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 10);
  expected_num_orphans =
       orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
  TxOrphanage::EraseForPeer(&orphanage.super_TxOrphanage,-1);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xbc;
  file_03.m_begin = (iterator)&local_6e8;
  msg_03.m_end = pvVar17;
  msg_03.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6f8,
             msg_03);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013d3cb0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf98c4c;
  txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_5b0;
  local_5b0 = (undefined1  [8])
              orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&expected_num_orphans;
  local_1b8[0] = orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                 _M_node_count == expected_num_orphans;
  local_1b8._8_4_ = 0;
  local_1b8._12_4_ = 0;
  local_1b8._16_4_ = 0;
  local_1b8._20_4_ = 0;
  local_50._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_50.m_message.px = (element_type *)0xee53cc;
  rng.super_RandomMixin<FastRandomContext>._8_8_ =
       rng.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  rng.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013d3cf0;
  rng.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  rng.rng.m_aligned.input._8_8_ = &txPrev;
  _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = &timeout_tx;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)&tx,1,2,REQUIRE,0xee5459,
             (size_t)&local_50,0xbc,&rng,"expected_num_orphans",local_208);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
  lVar18 = 0;
  do {
    TxOrphanage::EraseForPeer(&orphanage.super_TxOrphanage,lVar18);
    expected_num_orphans = expected_num_orphans - 2;
    local_708 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_700 = "";
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    local_710 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar19 = 0x507bac;
    file_04.m_end = (iterator)0xc4;
    file_04.m_begin = (iterator)&local_708;
    msg_04.m_end = pvVar17;
    msg_04.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_718,
               msg_04);
    local_208[0] = orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count == expected_num_orphans;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_10e75d9;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xee54a2;
    rng.super_RandomMixin<FastRandomContext>._8_8_ =
         rng.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
    rng.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_013d3df0;
    rng.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
    rng.rng.m_aligned.input._8_8_ = &tx;
    local_728 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_720 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_208,(lazy_ostream *)&rng,1,0,WARN,_cVar19,
               (size_t)&local_728,0xc4);
    boost::detail::shared_count::~shared_count(&sStack_1f8);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  FastRandomContext::FastRandomContext(&rng,true);
  TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,(uint)expected_num_orphans,&rng);
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xca;
  file_05.m_begin = (iterator)&local_738;
  msg_05.m_end = pvVar17;
  msg_05.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_748,
             msg_05);
  local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8._16_4_ = 0x13e8138;
  local_1b8._20_4_ = 0;
  local_1b8._24_4_ = 0xf98c4c;
  sStack_19c = 0;
  local_5b8 = (undefined1  [8])
              orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_10dfb74;
  txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
  _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = &timeout_tx;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013d3cf0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_5b0;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_5b8;
  local_5b0 = (undefined1  [8])&expected_num_orphans;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       expected_num_orphans);
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xca,local_208
             ,"expected_num_orphans",&tx);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  expected_num_orphans = expected_num_orphans - 1;
  TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,(uint)expected_num_orphans,&rng);
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xcd;
  file_06.m_begin = (iterator)&local_758;
  msg_06.m_end = pvVar17;
  msg_06.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_768,
             msg_06);
  local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8._16_4_ = 0x13e8138;
  local_1b8._20_4_ = 0;
  local_1b8._24_4_ = 0xf98c4c;
  sStack_19c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       expected_num_orphans);
  local_5b8 = (undefined1  [8])
              orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_10dfb74;
  txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
  _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = &timeout_tx;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013d3cf0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_5b0;
  pvVar16 = (iterator)0x1;
  pvVar17 = (iterator)0x2;
  timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_5b8;
  local_5b0 = (undefined1  [8])&expected_num_orphans;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xcd,local_208
             ,"expected_num_orphans",&tx);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (0x28 < expected_num_orphans) {
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,0x28,&rng);
    local_778 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_770 = "";
    local_788 = &boost::unit_test::basic_cstring<char_const>::null;
    local_780 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xd0;
    file_07.m_begin = (iterator)&local_778;
    msg_07.m_end = pvVar17;
    msg_07.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_788,
               msg_07);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    local_5b8 = (undefined1  [8])
                orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
    pCVar2 = (pointer)(local_7f4 + 4);
    local_7f4[4] = '(';
    local_7f4[5] = '\0';
    local_7f4[6] = '\0';
    local_7f4[7] = '\0';
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         0x28);
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = &timeout_tx;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b0;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xd0,
               local_208,"40",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,10,&rng);
    local_798 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_790 = "";
    local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = &DAT_000000d2;
    file_08.m_begin = (iterator)&local_798;
    msg_08.m_end = pvVar17;
    msg_08.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_7a8,
               msg_08);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    local_5b8 = (undefined1  [8])
                orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         10);
    local_7f4[4] = '\n';
    local_7f4[5] = '\0';
    local_7f4[6] = '\0';
    local_7f4[7] = '\0';
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = &timeout_tx;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b0;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xd2,
               local_208,"10",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,0,&rng);
    local_7b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7b0 = "";
    local_7c8._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xd4;
    file_09.m_begin = (iterator)&local_7b8;
    msg_09.m_end = pvVar17;
    msg_09.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)local_7c8,
               msg_09);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    local_5b8 = (undefined1  [8])
                orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         0);
    stack0xfffffffffffff810 = (ulong)uStack_7ec << 0x20;
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = &timeout_tx;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b0;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xd4,
               local_208,"0",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    local_208 = (undefined1  [8])0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    MakeTransactionSpending
              ((orphanage_tests *)&timeout_tx,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,&rng);
    if (local_208 != (undefined1  [8])0x0) {
      operator_delete((void *)local_208,(long)sStack_1f8.pi_ - (long)local_208);
    }
    TxOrphanage::AddTx(&orphanage.super_TxOrphanage,&timeout_tx,0);
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_7d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_7d0 = "";
    local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0xda;
    file_10.m_begin = (iterator)&local_7d8;
    msg_10.m_end = pvVar17;
    msg_10.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_7e8,
               msg_10);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    stack0xfffffffffffff810 =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_5b8 = (undefined1  [8])local_7f4;
    local_7f4[0] = '\x01';
    local_7f4[1] = '\0';
    local_7f4[2] = '\0';
    local_7f4[3] = '\0';
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (CTransactionRef *)local_5b0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         1);
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xda,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,"1",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    SetMockTime((seconds)(mock_time_in.__r + 0x4af));
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_808 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_800 = "";
    local_818 = &boost::unit_test::basic_cstring<char_const>::null;
    local_810 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0xdf;
    file_11.m_begin = (iterator)&local_808;
    msg_11.m_end = pvVar17;
    msg_11.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_818,
               msg_11);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    stack0xfffffffffffff810 =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         1);
    local_7f4[0] = '\x01';
    local_7f4[1] = '\0';
    local_7f4[2] = '\0';
    local_7f4[3] = '\0';
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (CTransactionRef *)local_5b0;
    local_5b8 = (undefined1  [8])local_7f4;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xdf,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,"1",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    SetMockTime((seconds)(mock_time_in.__r + 0x4b0));
    local_828 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_820 = "";
    local_838 = &boost::unit_test::basic_cstring<char_const>::null;
    local_830 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0xe3;
    file_12.m_begin = (iterator)&local_828;
    msg_12.m_end = pvVar17;
    msg_12.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_838,
               msg_12);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    stack0xfffffffffffff810 =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         1);
    local_7f4[0] = '\x01';
    local_7f4[1] = '\0';
    local_7f4[2] = '\0';
    local_7f4[3] = '\0';
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (CTransactionRef *)local_5b0;
    local_5b8 = (undefined1  [8])local_7f4;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xe3,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,"1",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    TxOrphanage::LimitOrphans(&orphanage.super_TxOrphanage,1,&rng);
    local_848 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
    ;
    local_840 = "";
    local_858 = &boost::unit_test::basic_cstring<char_const>::null;
    local_850 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0xe5;
    file_13.m_begin = (iterator)&local_848;
    msg_13.m_end = pvVar17;
    msg_13.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_858,
               msg_13);
    local_1b8._8_4_ = local_1b8._8_4_ & 0xffffff00;
    local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_1b8._16_4_ = 0x13e8138;
    local_1b8._20_4_ = 0;
    local_1b8._24_4_ = 0xf98c4c;
    sStack_19c = 0;
    stack0xfffffffffffff810 =
         orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (orphanage.super_TxOrphanage.m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         0);
    local_7f4[0] = '\0';
    local_7f4[1] = '\0';
    local_7f4[2] = '\0';
    local_7f4[3] = '\0';
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_10dfb74;
    txPrev.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xee53cc;
    _Stack_200._M_pi = _Stack_200._M_pi & 0xffffffffffffff00;
    local_208 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
    sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f0 = (CTransactionRef *)local_5b0;
    local_5b8 = (undefined1  [8])local_7f4;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013d3e70;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_5b8;
    local_5b0 = (undefined1  [8])pCVar2;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xee5459,(size_t)&txPrev,0xe5,
               (vector<COutPoint,_std::allocator<COutPoint>_> *)local_208,"0",&tx);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    if (timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (timeout_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ChaCha20::~ChaCha20(&rng.rng);
    keystore.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FillableSigningProvider_013e4e20;
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&keystore.mapScripts._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&keystore.mapKeys._M_t);
    if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )key.keydata._M_t.
          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&key.keydata,
                 (array<unsigned_char,_32UL> *)
                 key.keydata._M_t.
                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
    }
    if (orphanage.super_TxOrphanage.m_orphan_list.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(orphanage.super_TxOrphanage.m_orphan_list.
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)orphanage.super_TxOrphanage.m_orphan_list.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)orphanage.super_TxOrphanage.m_orphan_list.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
    ::~_Rb_tree(&orphanage.super_TxOrphanage.m_outpoint_to_orphan_it._M_t);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>,_std::_Select1st<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::set<transaction_identifier<true>,_std::less<transaction_identifier<true>_>,_std::allocator<transaction_identifier<true>_>_>_>_>_>
    ::~_Rb_tree(&orphanage.super_TxOrphanage.m_peer_work_set._M_t);
    std::
    _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
    ::~_Rb_tree((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                 *)&orphanage);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("expected_num_orphans > 40",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/orphanage_tests.cpp"
                ,0xce,"void orphanage_tests::DoS_mapOrphans::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_mapOrphans)
{
    // This test had non-deterministic coverage due to
    // randomly selected seeds.
    // This seed is chosen so that all branches of the function
    // ecdsa_signature_parse_der_lax are executed during this test.
    // Specifically branches that run only when an ECDSA
    // signature's R and S values have leading zeros.
    m_rng.Reseed(uint256{33});

    TxOrphanageTest orphanage{m_rng};
    CKey key;
    MakeNewKeyWithFastRandomContext(key, m_rng);
    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKey(key));

    // Freeze time for length of test
    auto now{GetTime<std::chrono::seconds>()};
    SetMockTime(now);

    // 50 orphan transactions:
    for (int i = 0; i < 50; i++)
    {
        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vin[0].prevout.n = 0;
        tx.vin[0].prevout.hash = Txid::FromUint256(m_rng.rand256());
        tx.vin[0].scriptSig << OP_1;
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));

        orphanage.AddTx(MakeTransactionRef(tx), i);
    }

    // ... and 50 that depend on other orphans:
    for (int i = 0; i < 50; i++)
    {
        CTransactionRef txPrev = orphanage.RandomOrphan();

        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vin[0].prevout.n = 0;
        tx.vin[0].prevout.hash = txPrev->GetHash();
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
        SignatureData empty;
        BOOST_CHECK(SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty));

        orphanage.AddTx(MakeTransactionRef(tx), i);
    }

    // This really-big orphan should be ignored:
    for (int i = 0; i < 10; i++)
    {
        CTransactionRef txPrev = orphanage.RandomOrphan();

        CMutableTransaction tx;
        tx.vout.resize(1);
        tx.vout[0].nValue = 1*CENT;
        tx.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key.GetPubKey()));
        tx.vin.resize(2777);
        for (unsigned int j = 0; j < tx.vin.size(); j++)
        {
            tx.vin[j].prevout.n = j;
            tx.vin[j].prevout.hash = txPrev->GetHash();
        }
        SignatureData empty;
        BOOST_CHECK(SignSignature(keystore, *txPrev, tx, 0, SIGHASH_ALL, empty));
        // Reuse same signature for other inputs
        // (they don't have to be valid for this test)
        for (unsigned int j = 1; j < tx.vin.size(); j++)
            tx.vin[j].scriptSig = tx.vin[0].scriptSig;

        BOOST_CHECK(!orphanage.AddTx(MakeTransactionRef(tx), i));
    }

    size_t expected_num_orphans = orphanage.CountOrphans();

    // Non-existent peer; nothing should be deleted
    orphanage.EraseForPeer(/*peer=*/-1);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);

    // Each of first three peers stored
    // two transactions each.
    for (NodeId i = 0; i < 3; i++)
    {
        orphanage.EraseForPeer(i);
        expected_num_orphans -= 2;
        BOOST_CHECK(orphanage.CountOrphans() == expected_num_orphans);
    }

    // Test LimitOrphanTxSize() function, nothing should timeout:
    FastRandomContext rng{/*fDeterministic=*/true};
    orphanage.LimitOrphans(/*max_orphans=*/expected_num_orphans, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);
    expected_num_orphans -= 1;
    orphanage.LimitOrphans(/*max_orphans=*/expected_num_orphans, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), expected_num_orphans);
    assert(expected_num_orphans > 40);
    orphanage.LimitOrphans(40, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 40);
    orphanage.LimitOrphans(10, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 10);
    orphanage.LimitOrphans(0, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 0);

    // Add one more orphan, check timeout logic
    auto timeout_tx = MakeTransactionSpending(/*outpoints=*/{}, rng);
    orphanage.AddTx(timeout_tx, 0);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);

    // One second shy of expiration
    SetMockTime(now + ORPHAN_TX_EXPIRE_TIME - 1s);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);

    // Jump one more second, orphan should be timed out on limiting
    SetMockTime(now + ORPHAN_TX_EXPIRE_TIME);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 1);
    orphanage.LimitOrphans(1, rng);
    BOOST_CHECK_EQUAL(orphanage.CountOrphans(), 0);
}